

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.hh
# Opt level: O1

string * phosg::Arguments::exc_prefix(string *__return_storage_ptr__,string *name)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(","");
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,(name->_M_dataplus)._M_p,name->_M_string_length);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,") ");
  return __return_storage_ptr__;
}

Assistant:

static inline std::string exc_prefix(const std::string& name) {
    std::string ret = "(";
    ret += name;
    ret += ") ";
    return ret;
  }